

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

void garray_list(_garray *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  _array *p_Var3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  t_atom *a;
  bool bVar7;
  t_float tVar8;
  int elemsize;
  int yonset;
  undefined8 local_38;
  
  local_38 = in_RAX;
  p_Var3 = garray_getarray_floatonly(x,(int *)((long)&local_38 + 4),(int *)&local_38);
  if (p_Var3 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
    return;
  }
  if (1 < argc) {
    tVar8 = atom_getfloat(argv);
    uVar2 = (uint)tVar8;
    uVar5 = argc - 1;
    a = argv + 1;
    if ((int)uVar2 < 0) {
      bVar7 = SCARRY4(uVar5,uVar2);
      uVar5 = uVar5 + uVar2;
      if (uVar5 == 0 || bVar7 != (int)uVar5 < 0) {
        return;
      }
      a = a + -(long)(int)uVar2;
      uVar2 = 0;
    }
    iVar1 = p_Var3->a_n;
    if (((int)(uVar2 + uVar5) <= iVar1) ||
       (uVar5 = iVar1 - uVar2, uVar5 != 0 && (int)uVar2 <= iVar1)) {
      uVar6 = (ulong)uVar5;
      lVar4 = (ulong)uVar2 * (long)(int)local_38 + (long)local_38._4_4_ * 4;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        tVar8 = atom_getfloat(a);
        *(t_float *)(p_Var3->a_vec + lVar4) = tVar8;
        a = a + 1;
        lVar4 = lVar4 + (int)local_38;
      }
      garray_redraw(x);
      return;
    }
  }
  return;
}

Assistant:

static void garray_list(t_garray *x, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    int yonset, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    if (argc < 2) return;
    else
    {
        int firstindex = atom_getfloat(argv);
        argc--;
        argv++;
            /* drop negative x values */
        if (firstindex < 0)
        {
            argc += firstindex;
            argv -= firstindex;
            firstindex = 0;
            if (argc <= 0) return;
        }
        if (argc + firstindex > array->a_n)
        {
            argc = array->a_n - firstindex;
            if (argc <= 0) return;
        }
        for (i = 0; i < argc; i++)
            *((t_float *)(array->a_vec + elemsize * (i + firstindex)) + yonset)
                = atom_getfloat(argv + i);
    }
    garray_redraw(x);
}